

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,
          FileDescriptorProto *containing_file,OptionStyle style)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int path2;
  undefined4 extraout_var;
  FieldDescriptor *field;
  LogMessage *pLVar4;
  UninterpretedOption *uninterpreted_option;
  string *value;
  Parser *pPVar5;
  FileDescriptorProto *containing_file_00;
  long lVar6;
  Reflection *this_00;
  Reflection *this_01;
  LocationRecorder *this_02;
  uint uVar7;
  LogFinisher local_a1;
  LocationRecorder name_location;
  LocationRecorder part_location;
  LocationRecorder location;
  
  iVar3 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  std::__cxx11::string::string
            ((string *)&name_location,"uninterpreted_option",(allocator *)&location);
  field = Descriptor::FindFieldByName
                    ((Descriptor *)CONCAT44(extraout_var,iVar3),(string *)&name_location);
  std::__cxx11::string::~string((string *)&name_location);
  if (field == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&name_location,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x58e);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&name_location,
                        "CHECK failed: uninterpreted_option_field != NULL: ");
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)&location,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&name_location);
  }
  (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  iVar3 = *(int *)(field + 0x44);
  path2 = Reflection::FieldSize(this_00,options,field);
  LocationRecorder::LocationRecorder(&location,options_location,iVar3,path2);
  if ((style != OPTION_STATEMENT) || (bVar1 = Consume(this,"option"), bVar1)) {
    (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
    containing_file_00 = (FileDescriptorProto *)0x0;
    uninterpreted_option =
         (UninterpretedOption *)Reflection::AddMessage(this_01,options,field,(MessageFactory *)0x0);
    LocationRecorder::LocationRecorder(&name_location,&location,2);
    LocationRecorder::RecordLegacyLocation
              (&name_location,(Message *)uninterpreted_option,OPTION_NAME);
    LocationRecorder::LocationRecorder
              (&part_location,&name_location,
               (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_);
    bVar1 = ParseOptionNamePart(this,uninterpreted_option,&part_location,containing_file_00);
    LocationRecorder::~LocationRecorder(&part_location);
    if (bVar1) {
LAB_00320f01:
      bVar1 = LookingAt(this,".");
      if (!bVar1) {
        LocationRecorder::~LocationRecorder(&name_location);
        bVar1 = Consume(this,"=");
        if (!bVar1) goto LAB_00320f55;
        LocationRecorder::LocationRecorder(&part_location,&location);
        uVar7 = 8;
        LocationRecorder::RecordLegacyLocation
                  (&part_location,(Message *)uninterpreted_option,OPTION_VALUE);
        bVar1 = TryConsume(this,"-");
        switch((this->input_->current_).type) {
        case TYPE_START:
          internal::LogMessage::LogMessage
                    ((LogMessage *)&name_location,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
                     ,0x5c3);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)&name_location,
                              "Trying to read value before any tokens have been read.");
          internal::LogFinisher::operator=(&local_a1,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)&name_location);
          break;
        case TYPE_END:
          std::__cxx11::string::string
                    ((string *)&name_location,"Unexpected end of stream while parsing option value."
                     ,(allocator *)&local_a1);
          AddError(this,(string *)&name_location);
          goto LAB_0032124a;
        case TYPE_IDENTIFIER:
          SourceCodeInfo_Location::_internal_add_path(part_location.location_,3);
          if (bVar1) {
            std::__cxx11::string::string
                      ((string *)&name_location,"Invalid \'-\' symbol before identifier.",
                       (allocator *)&local_a1);
            AddError(this,(string *)&name_location);
          }
          else {
            name_location.parser_ = (Parser *)&name_location.location_;
            name_location.source_code_info_ = (SourceCodeInfo *)0x0;
            name_location.location_._0_1_ = 0;
            bVar1 = ConsumeIdentifier(this,(string *)&name_location,"Expected identifier.");
            if (bVar1) {
              UninterpretedOption::_internal_set_identifier_value
                        (uninterpreted_option,(string *)&name_location);
LAB_0032121b:
              std::__cxx11::string::~string((string *)&name_location);
              goto switchD_00320fe1_default;
            }
          }
          goto LAB_0032124a;
        case TYPE_INTEGER:
          bVar2 = ConsumeInteger64(this,(ulong)bVar1 - 1 | 0x8000000000000000,
                                   (uint64 *)&name_location,"Expected integer.");
          if (bVar2) {
            if (bVar1) {
              SourceCodeInfo_Location::_internal_add_path(part_location.location_,5);
              lVar6 = 0x50;
              uVar7 = 0x10;
              pPVar5 = (Parser *)-(long)name_location.parser_;
            }
            else {
              SourceCodeInfo_Location::_internal_add_path(part_location.location_,4);
              lVar6 = 0x48;
              pPVar5 = name_location.parser_;
            }
            (uninterpreted_option->_has_bits_).has_bits_[0] =
                 (uninterpreted_option->_has_bits_).has_bits_[0] | uVar7;
            *(Parser **)
             ((long)&(((UninterpretedOption *)(&uninterpreted_option->_has_bits_ + -4))->
                     super_Message).super_MessageLite._vptr_MessageLite + lVar6) = pPVar5;
            goto switchD_00320fe1_default;
          }
          break;
        case TYPE_FLOAT:
          SourceCodeInfo_Location::_internal_add_path(part_location.location_,6);
          bVar2 = ConsumeNumber(this,(double *)&name_location,"Expected number.");
          if (bVar2) {
            pPVar5 = name_location.parser_;
            if (bVar1) {
              pPVar5 = (Parser *)((ulong)name_location.parser_ ^ 0x8000000000000000);
            }
            (uninterpreted_option->_has_bits_).has_bits_[0] =
                 (uninterpreted_option->_has_bits_).has_bits_[0] | 0x20;
            uninterpreted_option->double_value_ = (double)pPVar5;
            goto switchD_00320fe1_default;
          }
          break;
        case TYPE_STRING:
          SourceCodeInfo_Location::_internal_add_path(part_location.location_,7);
          if (bVar1) {
            std::__cxx11::string::string
                      ((string *)&name_location,"Invalid \'-\' symbol before string.",
                       (allocator *)&local_a1);
            AddError(this,(string *)&name_location);
          }
          else {
            name_location.parser_ = (Parser *)&name_location.location_;
            name_location.source_code_info_ = (SourceCodeInfo *)0x0;
            name_location.location_._0_1_ = 0;
            bVar1 = ConsumeString(this,(string *)&name_location,"Expected string.");
            if (bVar1) {
              UninterpretedOption::_internal_set_string_value
                        (uninterpreted_option,(string *)&name_location);
              goto LAB_0032121b;
            }
          }
LAB_0032124a:
          std::__cxx11::string::~string((string *)&name_location);
          break;
        case TYPE_SYMBOL:
          bVar1 = LookingAt(this,"{");
          if (!bVar1) {
            std::__cxx11::string::string
                      ((string *)&name_location,"Expected option value.",(allocator *)&local_a1);
            AddError(this,(string *)&name_location);
            goto LAB_0032124a;
          }
          SourceCodeInfo_Location::_internal_add_path(part_location.location_,8);
          value = UninterpretedOption::_internal_mutable_aggregate_value_abi_cxx11_
                            (uninterpreted_option);
          bVar1 = ParseUninterpretedBlock(this,value);
          if (bVar1) goto switchD_00320fe1_default;
          break;
        default:
switchD_00320fe1_default:
          LocationRecorder::~LocationRecorder(&part_location);
          if ((style == OPTION_STATEMENT) &&
             (bVar1 = ConsumeEndOfDeclaration(this,";",&location), !bVar1)) goto LAB_00320f55;
          bVar1 = true;
          goto LAB_00320f57;
        }
        this_02 = &part_location;
        goto LAB_00320f50;
      }
      bVar1 = Consume(this,".");
      if (bVar1) goto code_r0x00320f1f;
    }
LAB_00320f4b:
    this_02 = &name_location;
LAB_00320f50:
    LocationRecorder::~LocationRecorder(this_02);
  }
LAB_00320f55:
  bVar1 = false;
LAB_00320f57:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
code_r0x00320f1f:
  LocationRecorder::LocationRecorder
            (&part_location,&name_location,
             (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_);
  bVar1 = ParseOptionNamePart(this,uninterpreted_option,&part_location,containing_file_00);
  LocationRecorder::~LocationRecorder(&part_location);
  if (!bVar1) goto LAB_00320f4b;
  goto LAB_00320f01;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         const FileDescriptorProto* containing_file,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option =
      down_cast<UninterpretedOption*>(options->GetReflection()->AddMessage(
          options, uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        std::string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              static_cast<int64>(-value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        std::string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}